

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O3

void __thiscall
node::BlockAssembler::BlockAssembler
          (BlockAssembler *this,Chainstate *chainstate,CTxMemPool *mempool,Options *options)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  undefined7 uVar5;
  undefined8 uVar6;
  CTxMemPool *pCVar7;
  ulong uVar8;
  pointer *__ptr;
  long in_FS_OFFSET;
  bool local_49;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->pblocktemplate)._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl = (CBlockTemplate *)0x0;
  SaltedTxidHasher::SaltedTxidHasher((SaltedTxidHasher *)&this->inBlock);
  (this->inBlock)._M_h._M_buckets = &(this->inBlock)._M_h._M_single_bucket;
  (this->inBlock)._M_h._M_bucket_count = 1;
  (this->inBlock)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->inBlock)._M_h._M_element_count = 0;
  (this->inBlock)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->inBlock)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->inBlock)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->chainparams = (chainstate->m_chainman->m_options).chainparams;
  pCVar7 = (CTxMemPool *)0x0;
  if ((options->super_BlockCreateOptions).use_mempool != false) {
    pCVar7 = mempool;
  }
  this->m_mempool = pCVar7;
  this->m_chainstate = chainstate;
  bVar4 = (options->super_BlockCreateOptions).use_mempool;
  uVar5 = *(undefined7 *)&(options->super_BlockCreateOptions).field_0x1;
  uVar1 = (options->super_BlockCreateOptions).coinbase_max_additional_weight;
  uVar2 = (options->super_BlockCreateOptions).coinbase_output_max_additional_sigops;
  uVar3 = options->nBlockMaxWeight;
  local_48 = (options->blockMinFeeRate).nSatoshisPerK;
  uStack_40._0_1_ = options->test_block_validity;
  uStack_40._1_1_ = options->print_modified_fee;
  uStack_40._2_6_ = *(undefined6 *)&options->field_0x2a;
  local_49 = uVar1 < 0x3cf961;
  inline_assertion_check<true,bool>
            (&local_49,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/miner.cpp"
             ,0x46,"ClampOptions",
             "options.coinbase_max_additional_weight <= DEFAULT_BLOCK_MAX_WEIGHT");
  local_49 = uVar2 < 0x13881;
  inline_assertion_check<true,bool>
            (&local_49,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/miner.cpp"
             ,0x47,"ClampOptions",
             "options.coinbase_output_max_additional_sigops <= MAX_BLOCK_SIGOPS_COST");
  uVar6 = uStack_40;
  uVar8 = 0x3cf960;
  if (uVar3 < 0x3cf960) {
    uVar8 = uVar3;
  }
  if (uVar3 < uVar1) {
    uVar8 = uVar1;
  }
  (this->m_options).super_BlockCreateOptions.use_mempool = bVar4;
  *(undefined7 *)&(this->m_options).super_BlockCreateOptions.field_0x1 = uVar5;
  (this->m_options).super_BlockCreateOptions.coinbase_max_additional_weight = uVar1;
  (this->m_options).super_BlockCreateOptions.coinbase_output_max_additional_sigops = uVar2;
  (this->m_options).nBlockMaxWeight = uVar8;
  *(undefined4 *)&(this->m_options).blockMinFeeRate.nSatoshisPerK = (undefined4)local_48;
  *(undefined4 *)((long)&(this->m_options).blockMinFeeRate.nSatoshisPerK + 4) = local_48._4_4_;
  (this->m_options).test_block_validity = (bool)(undefined1)uStack_40;
  (this->m_options).print_modified_fee = (bool)uStack_40._1_1_;
  *(undefined2 *)&(this->m_options).field_0x2a = uStack_40._2_2_;
  *(undefined4 *)&(this->m_options).field_0x2c = uStack_40._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  uStack_40 = uVar6;
  __stack_chk_fail();
}

Assistant:

BlockAssembler::BlockAssembler(Chainstate& chainstate, const CTxMemPool* mempool, const Options& options)
    : chainparams{chainstate.m_chainman.GetParams()},
      m_mempool{options.use_mempool ? mempool : nullptr},
      m_chainstate{chainstate},
      m_options{ClampOptions(options)}
{
}